

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O2

void __thiscall
CaDiCaL::Internal::analyze_literal
          (Internal *this,int lit,int *open,int *resolvent_size,int *antecedent_size)

{
  int iVar1;
  pointer pFVar2;
  pointer pLVar3;
  Flags FVar4;
  int iVar5;
  uint uVar6;
  Clause *pCVar7;
  pointer pVVar8;
  int lit_local;
  int *local_40;
  uint64_t id;
  
  uVar6 = lit;
  if (lit < 1) {
    uVar6 = -lit;
  }
  pVVar8 = (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar2 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>._M_impl.
           super__Vector_impl_data._M_start;
  lit_local = lit;
  if (pVVar8[uVar6].level == 0) {
LAB_006371e2:
    if ((((uint)pFVar2[uVar6] & 1) == 0) && (this->lrat == true)) {
      pFVar2[uVar6] = (Flags)((uint)pFVar2[uVar6] | 1);
      std::vector<int,_std::allocator<int>_>::push_back(&this->unit_analyzed,&lit_local);
      uVar6 = lit_local;
      if (lit_local < 1) {
        uVar6 = -lit_local;
      }
      id = (this->unit_clauses_idx).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[(int)(uVar6 << 1 | (uint)-lit_local >> 0x1f)];
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->unit_chain,&id);
    }
  }
  else {
    *antecedent_size = *antecedent_size + 1;
    FVar4 = pFVar2[uVar6];
    if (((uint)FVar4 & 1) != 0) {
      return;
    }
    pVVar8 = pVVar8 + uVar6;
    local_40 = open;
    if (pVVar8->reason == this->external_reason) {
      pCVar7 = learn_external_reason_clause(this,-lit,0,true);
      pVVar8->reason = pCVar7;
      if (pCVar7 == (Clause *)0x0) {
        *antecedent_size = *antecedent_size + -1;
        goto LAB_006371e2;
      }
      FVar4 = pFVar2[uVar6];
    }
    pFVar2[uVar6] = (Flags)((uint)FVar4 | 1);
    std::vector<int,_std::allocator<int>_>::push_back(&this->analyzed,&lit_local);
    iVar5 = pVVar8->level;
    if (iVar5 < this->level) {
      std::vector<int,_std::allocator<int>_>::push_back(&this->clause,&lit_local);
      iVar5 = pVVar8->level;
    }
    pLVar3 = (this->control).super__Vector_base<CaDiCaL::Level,_std::allocator<CaDiCaL::Level>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar1 = pLVar3[iVar5].seen.count;
    pLVar3[iVar5].seen.count = iVar1 + 1;
    if (iVar1 == 0) {
      std::vector<int,_std::allocator<int>_>::push_back(&this->levels,&pVVar8->level);
    }
    if (pVVar8->trail < pLVar3[iVar5].seen.trail) {
      pLVar3[iVar5].seen.trail = pVVar8->trail;
    }
    *resolvent_size = *resolvent_size + 1;
    if (pVVar8->level == this->level) {
      *local_40 = *local_40 + 1;
    }
  }
  return;
}

Assistant:

inline void Internal::analyze_literal (int lit, int &open,
                                       int &resolvent_size,
                                       int &antecedent_size) {
  assert (lit);
  Var &v = var (lit);
  Flags &f = flags (lit);

  if (!v.level) {
    if (f.seen || !lrat)
      return;
    f.seen = true;
    unit_analyzed.push_back (lit);
    assert (val (lit) < 0);
    const unsigned uidx = vlit (-lit);
    uint64_t id = unit_clauses (uidx);
    assert (id);
    unit_chain.push_back (id);
    return;
  }
  ++antecedent_size;
  if (f.seen)
    return;

  // before marking as seen, get reason and check for missed unit

  assert (val (lit) < 0);
  assert (v.level <= level);
  if (v.reason == external_reason) {
    assert (!opts.exteagerreasons);
    v.reason = learn_external_reason_clause (-lit, 0, true);
    if (!v.reason) { // actually a unit
      --antecedent_size;
      LOG ("%d unit after explanation", -lit);
      if (f.seen || !lrat)
        return;
      f.seen = true;
      unit_analyzed.push_back (lit);
      assert (val (lit) < 0);
      const unsigned uidx = vlit (-lit);
      uint64_t id = unit_clauses (uidx);
      assert (id);
      unit_chain.push_back (id);
      return;
    }
  }

  f.seen = true;
  analyzed.push_back (lit);

  assert (v.reason != external_reason);
  if (v.level < level)
    clause.push_back (lit);
  Level &l = control[v.level];
  if (!l.seen.count++) {
    LOG ("found new level %d contributing to conflict", v.level);
    levels.push_back (v.level);
  }
  if (v.trail < l.seen.trail)
    l.seen.trail = v.trail;
  ++resolvent_size;
  LOG ("analyzed literal %d assigned at level %d", lit, v.level);
  if (v.level == level)
    open++;
}